

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_net.c
# Opt level: O0

void addrinfo_print_list(addrinfo *ailist)

{
  ushort uVar1;
  sockaddr_in *sa4;
  sockaddr_in6 *sa6;
  char *pcStack_58;
  uint port;
  void *addr;
  char *ipver;
  char addrstr [46];
  addrinfo *ai;
  addrinfo *ailist_local;
  
  unique0x100000dd = ailist;
  do {
    if (stack0xffffffffffffffe8 == (addrinfo *)0x0) {
      return;
    }
    if (stack0xffffffffffffffe8->ai_family == 10) {
      pcStack_58 = stack0xffffffffffffffe8->ai_addr->sa_data + 6;
      addr = anon_var_dwarf_4c32d;
      uVar1 = ntohs(*(uint16_t *)stack0xffffffffffffffe8->ai_addr->sa_data);
LAB_001afd0e:
      inet_ntop(stack0xffffffffffffffe8->ai_family,pcStack_58,(char *)&ipver,0x2e);
      printf("%s %s %d\n",addr,&ipver,(ulong)uVar1);
    }
    else if (stack0xffffffffffffffe8->ai_family == 2) {
      pcStack_58 = stack0xffffffffffffffe8->ai_addr->sa_data + 2;
      addr = anon_var_dwarf_4c343;
      uVar1 = ntohs(*(uint16_t *)stack0xffffffffffffffe8->ai_addr->sa_data);
      goto LAB_001afd0e;
    }
    unique0x00012000 = stack0xffffffffffffffe8->ai_next;
  } while( true );
}

Assistant:

void addrinfo_print_list(const struct addrinfo *ailist)
{
    const struct addrinfo *ai;
    char addrstr[INET6_ADDRSTRLEN];
    for (ai = ailist; ai != NULL; ai = ai->ai_next)
    {
        char *ipver;
        void *addr;
        unsigned int port = 0;
        if (ai->ai_family == AF_INET6)
        {
            struct sockaddr_in6 *sa6 = (struct sockaddr_in6 *)ai->ai_addr;
            addr = &(sa6->sin6_addr);
            ipver = "IPv6";
            port = ntohs(sa6->sin6_port);
        }
        else if (ai->ai_family == AF_INET)
        {
            struct sockaddr_in *sa4 = (struct sockaddr_in *)ai->ai_addr;
            addr = &(sa4->sin_addr);
            ipver = "IPv4";
            port = ntohs(sa4->sin_port);
        }
        else continue;
        INET_NTOP(ai->ai_family, addr, addrstr, INET6_ADDRSTRLEN);
        printf("%s %s %d\n", ipver, addrstr, port);
    }
}